

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

void AddCommandString(char *cmd,int keynum)

{
  char cVar1;
  char cVar2;
  long lVar3;
  DWaitingCommand *this;
  char *cmd_00;
  char *pcVar5;
  int tics;
  bool bVar6;
  char *pcVar4;
  
  if (cmd == (char *)0x0) {
    return;
  }
  cVar1 = *cmd;
joined_r0x00357b20:
  cmd_00 = cmd;
  if (cVar1 == '\0') {
    return;
  }
  do {
    cVar1 = *cmd_00;
    pcVar4 = cmd_00;
    if (cVar1 == '\"') {
      do {
        while( true ) {
          cmd_00 = pcVar4 + 1;
          if (*cmd_00 == '\"') break;
          pcVar4 = cmd_00;
          if (*cmd_00 == '\0') goto LAB_00357b59;
        }
        cVar1 = *pcVar4;
        pcVar4 = cmd_00;
      } while (cVar1 == '\\');
    }
    else if ((cVar1 == '\0') || (cVar1 == ';')) break;
LAB_00357b59:
    cmd_00 = cmd_00 + (*cmd_00 != '\0');
  } while( true );
  bVar6 = cVar1 == ';';
  if (bVar6) {
    *cmd_00 = '\0';
  }
  pcVar4 = cmd + 4;
  do {
    pcVar5 = pcVar4;
    cVar2 = pcVar5[-4];
    if (cVar2 == '\0') break;
    pcVar4 = pcVar5 + 1;
  } while (cVar2 < '!');
  if (cVar2 == '\0') goto LAB_00357bd1;
  if ((((cVar2 == 'w') && (ParsingKeyConf == false)) && (pcVar5[-3] == 'a')) &&
     ((pcVar5[-2] == 'i' && (pcVar5[-1] == 't')))) {
    if (*pcVar5 == '\0') {
      tics = 1;
    }
    else {
      if (*pcVar5 != ' ') goto LAB_00357bc6;
      lVar3 = strtol(pcVar5 + 1,(char **)0x0,0);
      tics = (int)lVar3;
    }
    if (0 < tics) {
      if (cVar1 != ';') {
        return;
      }
      *cmd_00 = ';';
      this = (DWaitingCommand *)
             M_Malloc_Dbg(0x48,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
      DWaitingCommand::DWaitingCommand(this,cmd_00,tics);
      return;
    }
  }
  else {
LAB_00357bc6:
    C_DoCommand(pcVar5 + -4,keynum);
  }
LAB_00357bd1:
  if (cVar1 == ';') {
    *cmd_00 = ';';
  }
  cmd = cmd_00 + bVar6;
  cVar1 = cmd_00[bVar6];
  goto joined_r0x00357b20;
}

Assistant:

void AddCommandString (char *cmd, int keynum)
{
	char *brkpt;
	int more;

	if (cmd)
	{
		while (*cmd)
		{
			brkpt = cmd;
			while (*brkpt != ';' && *brkpt != '\0')
			{
				if (*brkpt == '\"')
				{
					brkpt++;
					while (*brkpt != '\0' && (*brkpt != '\"' || *(brkpt-1) == '\\'))
						brkpt++;
				}
				if (*brkpt != '\0')
					brkpt++;
			}
			if (*brkpt == ';')
			{
				*brkpt = '\0';
				more = 1;
			}
			else
			{
				more = 0;
			}
			// Intercept wait commands here. Note: wait must be lowercase
			while (*cmd && *cmd <= ' ')
				cmd++;
			if (*cmd)
			{
				if (!ParsingKeyConf &&
					cmd[0] == 'w' && cmd[1] == 'a' && cmd[2] == 'i' && cmd[3] == 't' &&
					(cmd[4] == 0 || cmd[4] == ' '))
				{
					int tics;

					if (cmd[4] == ' ')
					{
						tics = strtol (cmd + 5, NULL, 0);
					}
					else
					{
						tics = 1;
					}
					if (tics > 0)
					{
						if (more)
						{ // The remainder of the command will be executed later
						  // Note that deferred commands lose track of which key
						  // (if any) they were pressed from.
							*brkpt = ';';
							new DWaitingCommand (brkpt, tics);
						}
						return;
					}
				}
				else
				{
					C_DoCommand (cmd, keynum);
				}
			}
			if (more)
			{
				*brkpt = ';';
			}
			cmd = brkpt + more;
		}
	}
}